

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtPrintBinary(word *pTruth,int nVars)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int local_2c;
  int Limit;
  int k;
  word *pLimit;
  word *pThis;
  int nVars_local;
  word *pTruth_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  iVar2 = Abc_MinInt(0x40,1 << ((byte)nVars & 0x1f));
  pLimit = pTruth;
  if (nVars < 2) {
    __assert_fail("nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x552,"void Abc_TtPrintBinary(word *, int)");
  }
  for (; pLimit < pTruth + iVar1; pLimit = pLimit + 1) {
    for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
      uVar3 = Abc_InfoHasBit((uint *)pLimit,local_2c);
      printf("%d",(ulong)uVar3);
    }
  }
  printf("\n");
  return;
}

Assistant:

static inline void Abc_TtPrintBinary( word * pTruth, int nVars )
{
    word * pThis, * pLimit = pTruth + Abc_TtWordNum(nVars);
    int k, Limit = Abc_MinInt( 64, (1 << nVars) );
    assert( nVars >= 2 );
    for ( pThis = pTruth; pThis < pLimit; pThis++ )
        for ( k = 0; k < Limit; k++ )
            printf( "%d", Abc_InfoHasBit( (unsigned *)pThis, k ) );
    printf( "\n" );
}